

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool anon_unknown.dwarf_5433e::parse_str_to_bool(string *s)

{
  bool bVar1;
  
  bVar1 = std::operator==(s,"true");
  if (!bVar1) {
    bVar1 = std::operator==(s,"1");
    if (!bVar1) {
      bVar1 = std::operator==(s,"yes");
      if (!bVar1) {
        bVar1 = std::operator==(s,"y");
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool parse_str_to_bool(const std::string & s) {
    if (s == "true" || s == "1" || s == "yes" || s == "y") {
        return true;
    }
    return false;
}